

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

int Cba_NtkIsTopoOrder(Cba_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Bit_t *p_00;
  Vec_Bit_t *vVisited;
  int fTopo;
  int iFanin;
  int iFin;
  int iObj;
  int k;
  int i;
  Cba_Ntk_t *p_local;
  
  vVisited._0_4_ = 1;
  iVar1 = Cba_NtkObjNum(p);
  p_00 = Vec_BitStart(iVar1 + 1);
  for (iObj = 0; iVar1 = Cba_NtkPiNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Cba_NtkPi(p,iObj);
    Vec_BitWriteEntry(p_00,iVar1,1);
  }
  for (iObj = 0; iVar1 = Cba_NtkBoxSeqNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Cba_NtkBoxSeq(p,iObj);
    Vec_BitWriteEntry(p_00,iVar1,1);
  }
  for (iFanin = 1; iVar1 = Vec_StrSize(&p->vObjType), iFanin < iVar1; iFanin = iFanin + 1) {
    iVar1 = Cba_ObjIsBox(p,iFanin);
    if ((iVar1 != 0) && (iVar1 = Cba_ObjIsSeq(p,iFanin), iVar1 == 0)) {
      for (fTopo = Cba_ObjFin0(p,iFanin); iVar1 = Cba_ObjFin0(p,iFanin + 1), fTopo < iVar1;
          fTopo = fTopo + 1) {
        iVar1 = Cba_FinFon(p,fTopo);
        iVar1 = Cba_FonObj(p,iVar1);
        if ((iVar1 != 0) && (iVar1 = Vec_BitEntry(p_00,iVar1), iVar1 == 0)) {
          vVisited._0_4_ = 0;
        }
      }
      if ((int)vVisited == 0) break;
      Vec_BitWriteEntry(p_00,iFanin,1);
    }
  }
  if ((int)vVisited != 0) {
    for (iObj = 0; iVar1 = Cba_NtkPoNum(p), iObj < iVar1; iObj = iObj + 1) {
      iVar1 = Cba_NtkPo(p,iObj);
      for (fTopo = Cba_ObjFin0(p,iVar1); iVar2 = Cba_ObjFin0(p,iVar1 + 1), fTopo < iVar2;
          fTopo = fTopo + 1) {
        iVar2 = Cba_FinFon(p,fTopo);
        iVar2 = Cba_FonObj(p,iVar2);
        if ((iVar2 != 0) && (iVar2 = Vec_BitEntry(p_00,iVar2), iVar2 == 0)) {
          vVisited._0_4_ = 0;
        }
      }
      if ((int)vVisited == 0) break;
    }
  }
  if ((int)vVisited != 0) {
    for (iObj = 0; iVar1 = Cba_NtkBoxSeqNum(p), iObj < iVar1; iObj = iObj + 1) {
      iVar1 = Cba_NtkBoxSeq(p,iObj);
      for (fTopo = Cba_ObjFin0(p,iVar1); iVar2 = Cba_ObjFin0(p,iVar1 + 1), fTopo < iVar2;
          fTopo = fTopo + 1) {
        iVar2 = Cba_FinFon(p,fTopo);
        iVar2 = Cba_FonObj(p,iVar2);
        if ((iVar2 != 0) && (iVar2 = Vec_BitEntry(p_00,iVar2), iVar2 == 0)) {
          vVisited._0_4_ = 0;
        }
      }
      if ((int)vVisited == 0) break;
    }
  }
  Vec_BitFree(p_00);
  return (int)vVisited;
}

Assistant:

int Cba_NtkIsTopoOrder( Cba_Ntk_t * p )
{
    int i, k, iObj, iFin, iFanin, fTopo = 1;
    Vec_Bit_t * vVisited = Vec_BitStart( Cba_NtkObjNum(p) + 1 );
    // mark PIs and seq objects
    Cba_NtkForEachPi( p, iObj, i )
        Vec_BitWriteEntry( vVisited, iObj, 1 );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Vec_BitWriteEntry( vVisited, iObj, 1 );
    // visit combinational nodes
    Cba_NtkForEachBox( p, iObj )
        if ( !Cba_ObjIsSeq(p, iObj) )
        {
            Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
                if ( !Vec_BitEntry(vVisited, iFanin) )
                    fTopo = 0;
            if ( !fTopo )
                break;
            Vec_BitWriteEntry( vVisited, iObj, 1 );
        }
    // visit POs and seq objects
    if ( fTopo )
    Cba_NtkForEachPo( p, iObj, i )
    {
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            if ( !Vec_BitEntry(vVisited, iFanin) )
                fTopo = 0;
        if ( !fTopo )
            break;
    }
    if ( fTopo )
    Cba_NtkForEachBoxSeq( p, iObj, i )
    {
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            if ( !Vec_BitEntry(vVisited, iFanin) )
                fTopo = 0;
        if ( !fTopo )
            break;
    }
    Vec_BitFree( vVisited );
    return fTopo;
}